

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwlock_test.cpp
# Opt level: O3

void __thiscall
SharedMutexTest_TryLockFail_Test<yamc::fair::basic_shared_mutex<yamc::rwlock::PhaseFairness>_>::
TestBody(SharedMutexTest_TryLockFail_Test<yamc::fair::basic_shared_mutex<yamc::rwlock::PhaseFairness>_>
         *this)

{
  undefined8 *puVar1;
  bool bVar2;
  char *in_R9;
  join_thread thd;
  barrier step;
  TypeParam mtx;
  AssertHelper local_160;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_158;
  thread local_150;
  internal local_148 [8];
  undefined8 *local_140;
  undefined1 local_138 [32];
  barrier local_118;
  undefined1 local_a8 [96];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  local_118.nthread_ = 2;
  local_118.count_ = 2;
  local_118.step_ = 0;
  std::condition_variable::condition_variable(&local_118.cv_);
  local_118.mtx_.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_118.mtx_.super___mutex_base._M_mutex._16_8_ = 0;
  local_118.mtx_.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_118.mtx_.super___mutex_base._M_mutex.__align = 0;
  local_118.mtx_.super___mutex_base._M_mutex._8_8_ = 0;
  local_a8._0_8_ = 0;
  local_a8._8_8_ = (TypeParam *)local_a8;
  local_a8._16_8_ = (TypeParam *)local_a8;
  std::condition_variable::condition_variable((condition_variable *)(local_a8 + 0x30));
  local_28 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_138._8_8_ = &local_118;
  local_138._0_8_ = (TypeParam *)local_a8;
  std::thread::
  thread<SharedMutexTest_TryLockFail_Test<yamc::fair::basic_shared_mutex<yamc::rwlock::PhaseFairness>>::TestBody()::_lambda()_1_,,void>
            (&local_150,(anon_class_16_2_20c777b2_for__M_head_impl *)local_138);
  yamc::test::barrier::await(&local_118);
  bVar2 = yamc::fair::basic_shared_mutex<yamc::rwlock::PhaseFairness>::try_lock
                    ((basic_shared_mutex<yamc::rwlock::PhaseFairness> *)local_a8);
  local_148[0] = (internal)!bVar2;
  local_140 = (undefined8 *)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_138,local_148,(AssertionResult *)"mtx.try_lock()","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/rwlock_test.cpp"
               ,0x82,(char *)local_138._0_8_);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    if ((TypeParam *)local_138._0_8_ != (TypeParam *)(local_138 + 0x10)) {
      operator_delete((void *)local_138._0_8_);
    }
    if (local_158._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_158._M_head_impl + 8))();
    }
    puVar1 = local_140;
    if (local_140 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_140 != local_140 + 2) {
        operator_delete((undefined8 *)*local_140);
      }
      operator_delete(puVar1);
    }
  }
  yamc::test::barrier::await(&local_118);
  yamc::test::join_thread::~join_thread((join_thread *)&local_150);
  std::condition_variable::~condition_variable((condition_variable *)(local_a8 + 0x30));
  std::condition_variable::~condition_variable(&local_118.cv_);
  return;
}

Assistant:

TYPED_TEST(SharedMutexTest, TryLockFail)
{
  yamc::test::barrier step(2);
  TypeParam mtx;
  // reader-thread
  yamc::test::join_thread thd([&]{
    ASSERT_NO_THROW(mtx.lock_shared());
    step.await();  // b1
    step.await();  // b2
    ASSERT_NO_THROW(mtx.unlock_shared());
  });
  // writer-thread
  {
    step.await();  // b1
    EXPECT_FALSE(mtx.try_lock());
    step.await();  // b2
  }
}